

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_mon_command(command *cmd)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  monster *mon_00;
  monster_lore_conflict *lore_00;
  loc_conflict grid_00;
  monster *t_mon_00;
  bool bVar6;
  wchar_t k;
  _Bool can_bash;
  _Bool can_open;
  monster *t_mon_1;
  _Bool has_hit;
  _Bool can_move;
  loc_conflict grid;
  wchar_t dir_1;
  object *obj;
  char o_name [80];
  wchar_t spell_index;
  _Bool seen;
  bitflag f [12];
  monster *t_mon;
  char local_78 [4];
  wchar_t dir;
  char m_name [80];
  monster_lore *lore;
  monster *mon;
  command *cmd_local;
  
  mon_00 = get_commanded_monster();
  if (mon_00 == (monster *)0x0) {
    __assert_fail("mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                  ,0x723,"void do_cmd_mon_command(struct command *)");
  }
  lore_00 = get_lore(mon_00->race);
  monster_desc(local_78,0x50,mon_00,L'̄');
  switch(cmd->code) {
  case CMD_WALK:
    bVar6 = false;
    t_mon_1._2_1_ = false;
    wVar4 = cmd_get_direction(cmd,"direction",&grid.x,false);
    if (wVar4 != L'\0') {
      return;
    }
    grid_00 = (loc_conflict)loc_sum((loc)mon_00->grid,ddgrid[grid.x]);
    _Var1 = flag_has_dbg(mon_00->race->flags,0xb,0x15,"mon->race->flags","RF_NEVER_MOVE");
    if (_Var1) {
      msg("The monster can not move.");
      return;
    }
    t_mon_00 = square_monster((chunk *)cave,grid_00);
    if (t_mon_00 == (monster *)0x0) {
      _Var1 = square_ispassable((chunk *)cave,grid_00);
      if (_Var1) {
        bVar6 = true;
      }
      else {
        _Var1 = square_isperm((chunk *)cave,grid_00);
        if (_Var1) {
          bVar6 = false;
        }
        else {
          _Var1 = monster_is_visible(mon_00);
          if (_Var1) {
            flag_on_dbg(lore_00->flags,0xb,0x2e,"lore->flags","RF_PASS_WALL");
            flag_on_dbg(lore_00->flags,0xb,0x2f,"lore->flags","RF_KILL_WALL");
            flag_on_dbg(lore_00->flags,0xb,0x30,"lore->flags","RF_SMASH_WALL");
          }
          _Var1 = flag_has_dbg(mon_00->race->flags,0xb,0x2e,"mon->race->flags","RF_PASS_WALL");
          if (_Var1) {
            bVar6 = true;
          }
          else {
            _Var1 = flag_has_dbg(mon_00->race->flags,0xb,0x2f,"mon->race->flags","RF_KILL_WALL");
            if (_Var1) {
              square_destroy_wall((chunk *)cave,grid_00);
              bVar6 = true;
            }
            else {
              _Var1 = flag_has_dbg(mon_00->race->flags,0xb,0x30,"mon->race->flags","RF_SMASH_WALL");
              if (_Var1) {
                square_smash_wall((chunk *)cave,grid_00);
                bVar6 = true;
              }
              else {
                _Var1 = square_iscloseddoor((chunk *)cave,grid_00);
                if ((_Var1) || (_Var1 = square_issecretdoor((chunk *)cave,grid_00), _Var1)) {
                  _Var1 = flag_has_dbg(mon_00->race->flags,0xb,0x2c,"mon->race->flags",
                                       "RF_OPEN_DOOR");
                  _Var2 = flag_has_dbg(mon_00->race->flags,0xb,0x2d,"mon->race->flags",
                                       "RF_BASH_DOOR");
                  _Var3 = monster_is_visible(mon_00);
                  if (_Var3) {
                    flag_on_dbg(lore_00->flags,0xb,0x2c,"lore->flags","RF_OPEN_DOOR");
                    flag_on_dbg(lore_00->flags,0xb,0x2d,"lore->flags","RF_BASH_DOOR");
                  }
                  if ((_Var2) || (_Var1)) {
                    _Var1 = square_islockeddoor((chunk *)cave,grid_00);
                    if (_Var1) {
                      wVar4 = square_door_power((chunk_conflict2 *)cave,grid_00);
                      wVar5 = Rand_div((int)mon_00->hp / 10);
                      if (wVar4 < wVar5) {
                        if (_Var2) {
                          msg("%s slams against the door.",local_78);
                        }
                        else {
                          msg("%s fiddles with the lock.",local_78);
                        }
                        square_set_door_lock((chunk_conflict2 *)cave,grid_00,wVar4 + L'\xffffffff');
                      }
                    }
                    else {
                      if (_Var2) {
                        square_smash_door((chunk *)cave,grid_00);
                        msg("You hear a door burst open!");
                      }
                      else {
                        square_open_door((chunk *)cave,grid_00);
                      }
                      bVar6 = true;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      t_mon_1._2_1_ = monster_attack_monster(mon_00,t_mon_00);
      bVar6 = false;
    }
    if (t_mon_1._2_1_ == false) {
      if (bVar6) {
        monster_swap(mon_00->grid,grid_00);
        player->upkeep->update = player->upkeep->update | 0x60;
      }
      else {
        msg("The way is blocked.");
      }
    }
    break;
  default:
    msg("Valid commands: move, stand still, \'d\'rop, \'m\'agic, or \'r\'elease.");
    return;
  case CMD_DROP:
    register0x00000000 = get_random_monster_object(mon_00);
    if (register0x00000000 != (object *)0x0) {
      register0x00000000->held_m_idx = 0;
      pile_excise(&mon_00->held_obj,register0x00000000);
      drop_near((chunk *)cave,(object **)&grid.y,L'\0',mon_00->grid,true,false);
      object_desc((char *)&obj,0x50,stack0xffffffffffffff00,0x43,player);
      _Var1 = ignore_item_ok(player,stack0xffffffffffffff00);
      if (!_Var1) {
        msg("%s drops %s.",local_78,&obj);
      }
    }
    break;
  case CMD_CAST:
    t_mon._4_4_ = 0;
    f[4] = '\0';
    f[5] = '\0';
    f[6] = '\0';
    f[7] = '\0';
    f[8] = '\0';
    f[9] = '\0';
    f[10] = '\0';
    f[0xb] = '\0';
    bVar6 = player->timed[2] == 0;
    target_set_monster((monster *)0x0);
    get_aim_dir((int *)((long)&t_mon + 4));
    f._4_8_ = target_get_monster();
    if ((monster *)f._4_8_ == (monster *)0x0) {
      msg("No target monster selected!");
      return;
    }
    (mon_00->target).midx = ((monster *)f._4_8_)->midx;
    flag_copy((bitflag *)&spell_index,mon_00->race->spell_flags,0xc);
    wVar4 = choose_attack_spell((bitflag *)&spell_index,true,true);
    if (wVar4 == L'\0') {
      msg("This monster has no spells!");
      return;
    }
    do_mon_spell(wVar4,mon_00,bVar6);
    if (bVar6) {
      flag_on_dbg(lore_00->spell_flags,0xc,wVar4,"lore->spell_flags","spell_index");
      _Var1 = mon_spell_is_innate(wVar4);
      if (_Var1) {
        if (lore_00->cast_innate != 0xff) {
          lore_00->cast_innate = lore_00->cast_innate + '\x01';
        }
      }
      else if (lore_00->cast_spell != 0xff) {
        lore_00->cast_spell = lore_00->cast_spell + '\x01';
      }
    }
    if (((player->is_dead & 1U) != 0) && (lore_00->deaths < 0x7fff)) {
      lore_00->deaths = lore_00->deaths + 1;
    }
    lore_update(mon_00->race,lore_00);
    break;
  case CMD_READ_SCROLL:
    mon_clear_timed(mon_00,L'\b',L'\x01');
    player_clear_timed(player,L',',true,false);
    break;
  case CMD_HOLD:
  }
  player->upkeep->energy_use = (uint)z_info->move_energy;
  return;
}

Assistant:

void do_cmd_mon_command(struct command *cmd)
{
	struct monster *mon = get_commanded_monster();
	struct monster_lore *lore = NULL;
	char m_name[80];

	assert(mon);
	lore = get_lore(mon->race);

	/* Get the monster name */
	monster_desc(m_name, sizeof(m_name), mon,
		MDESC_CAPITAL | MDESC_IND_HID | MDESC_COMMA);

	switch (cmd->code) {
		case CMD_READ_SCROLL: {
			/* Actually 'r'elease monster */
			mon_clear_timed(mon, MON_TMD_COMMAND, MON_TMD_FLG_NOTIFY);
			player_clear_timed(player, TMD_COMMAND, true, false);
			break;
		}
		case CMD_CAST: {
			int dir = DIR_UNKNOWN;
			struct monster *t_mon = NULL;
			bitflag f[RSF_SIZE];
			bool seen = player->timed[TMD_BLIND] ? false : true;
			int spell_index;

			/* Choose a target monster */
			target_set_monster(NULL);
			get_aim_dir(&dir);
			t_mon = target_get_monster();
			if (!t_mon) {
				msg("No target monster selected!");
				return;
			}
			mon->target.midx = t_mon->midx;

			/* Pick a random spell and cast it */
			rsf_copy(f, mon->race->spell_flags);
			spell_index = choose_attack_spell(f, true, true);
			if (!spell_index) {
				msg("This monster has no spells!");
				return;
			}
			do_mon_spell(spell_index, mon, seen);

			/* Remember what the monster did */
			if (seen) {
				rsf_on(lore->spell_flags, spell_index);
				if (mon_spell_is_innate(spell_index)) {
					/* Innate spell */
					if (lore->cast_innate < UCHAR_MAX)
						lore->cast_innate++;
				} else {
					/* Bolt or Ball, or Special spell */
					if (lore->cast_spell < UCHAR_MAX)
						lore->cast_spell++;
				}
			}
			if (player->is_dead && (lore->deaths < SHRT_MAX)) {
				lore->deaths++;
			}
			lore_update(mon->race, lore);

			break;
		}
		case CMD_DROP: {
			char o_name[80];
			struct object *obj = get_random_monster_object(mon);
			if (!obj) break;
			obj->held_m_idx = 0;
			pile_excise(&mon->held_obj, obj);
			drop_near(cave, &obj, 0, mon->grid, true, false);
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, player);
			if (!ignore_item_ok(player, obj)) {
				msg("%s drops %s.", m_name, o_name);
			}

			break;
		}
		case CMD_HOLD: {
			/* Do nothing */
			break;
		}
		case CMD_WALK: {
			int dir;
			struct loc grid;
			bool can_move = false;
			bool has_hit = false;
			struct monster *t_mon = NULL;

			/* Get arguments */
			if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
				return;
			grid = loc_sum(mon->grid, ddgrid[dir]);

			/* Don't let immobile monsters be moved */
			if (rf_has(mon->race->flags, RF_NEVER_MOVE)) {
				msg("The monster can not move.");
				return;
			}

			/* Monster there - attack */
			t_mon = square_monster(cave, grid);
			if (t_mon) {
				/* Attack the monster */
				if (monster_attack_monster(mon, t_mon)) {
					has_hit = true;
				} else {
					can_move = false;
				}
			} else if (square_ispassable(cave, grid)) {
				/* Floor is open? */
				can_move = true;
			} else if (square_isperm(cave, grid)) {
				/* Permanent wall in the way */
				can_move = false;
			} else {
				/* There's some kind of feature in the way, so learn about
				 * kill-wall and pass-wall now */
				if (monster_is_visible(mon)) {
					rf_on(lore->flags, RF_PASS_WALL);
					rf_on(lore->flags, RF_KILL_WALL);
					rf_on(lore->flags, RF_SMASH_WALL);
				}

				/* Monster may be able to deal with walls and doors */
				if (rf_has(mon->race->flags, RF_PASS_WALL)) {
					can_move = true;
				} else if (rf_has(mon->race->flags, RF_KILL_WALL)) {
					/* Remove the wall */
					square_destroy_wall(cave, grid);
					can_move = true;
				} else if (rf_has(mon->race->flags, RF_SMASH_WALL)) {
					/* Remove everything */
					square_smash_wall(cave, grid);
					can_move = true;
				} else if (square_iscloseddoor(cave, grid) ||
						   square_issecretdoor(cave, grid)) {
					bool can_open = rf_has(mon->race->flags, RF_OPEN_DOOR);
					bool can_bash = rf_has(mon->race->flags, RF_BASH_DOOR);

					/* Learn about door abilities */
					if (monster_is_visible(mon)) {
						rf_on(lore->flags, RF_OPEN_DOOR);
						rf_on(lore->flags, RF_BASH_DOOR);
					}

					/* If the monster can deal with doors, prefer to bash */
					if (can_bash || can_open) {
						/* Now outcome depends on type of door */
						if (square_islockeddoor(cave, grid)) {
							/* Test strength against door strength */
							int k = square_door_power(cave, grid);
							if (randint0(mon->hp / 10) > k) {
								if (can_bash) {
									msg("%s slams against the door.", m_name);
								} else {
									msg("%s fiddles with the lock.", m_name);
								}

								/* Reduce the power of the door by one */
								square_set_door_lock(cave, grid, k - 1);
							}
						} else {
							/* Closed or secret door -- always open or bash */
							if (can_bash) {
								square_smash_door(cave, grid);

								msg("You hear a door burst open!");

								/* Fall into doorway */
								can_move = true;
							} else {
								square_open_door(cave, grid);
								can_move = true;
							}
						}
					}
				}
			}

			if (has_hit) {
				break;
			} else if (can_move) {
				monster_swap(mon->grid, grid);
				player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
			} else {
				msg("The way is blocked.");
			}
			break;
		}
		default: {
			msg("Valid commands: move, stand still, 'd'rop, 'm'agic, or 'r'elease.");
			return;
		}
	}


	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;
}